

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_6db88::ParserImpl::ParseTableConstructor(ParserImpl *this)

{
  int iVar1;
  TokenDetail op;
  TokenDetail op_00;
  TokenDetail op_01;
  TokenDetail op_02;
  vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
  *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  TokenDetail *pTVar4;
  anon_union_8_2_010d16d7_for_TokenDetail_0 *paVar5;
  ParseException *pPVar6;
  TokenDetail *pTVar7;
  ParserImpl *in_RSI;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aVar8;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> index;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> value;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> value_2;
  TokenDetail name;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_c8;
  undefined1 local_c0 [16];
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_b0;
  TokenDetail *local_a8;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_a0;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_98;
  String *pSStack_90;
  undefined8 local_88;
  int iStack_80;
  undefined4 uStack_7c;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_78;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aStack_70;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_68;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aStack_60;
  _func_int **local_50;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> local_48;
  _func_int **local_40;
  _func_int **local_38;
  
  local_48._M_head_impl = (SyntaxTree *)this;
  NextToken(in_RSI);
  if ((in_RSI->current_).token_ != 0x7b) {
    __assert_fail("current_.token_ == \'{\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                  ,0x2f6,
                  "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseTableConstructor()"
                 );
  }
  local_a8 = &in_RSI->current_;
  local_50 = (_func_int **)operator_new(0x28);
  iVar1 = (in_RSI->current_).line_;
  *local_50 = (_func_int *)&PTR__TableDefine_00154418;
  this_00 = (vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
             *)(local_50 + 1);
  local_50[1] = (_func_int *)0x0;
  local_50[2] = (_func_int *)0x0;
  local_50[3] = (_func_int *)0x0;
  *(int *)(local_50 + 4) = iVar1;
  pTVar7 = &in_RSI->look_ahead_;
  local_40 = (_func_int **)&PTR__TableNameField_00154498;
  local_38 = (_func_int **)&PTR__TableArrayField_001544d8;
  while( true ) {
    if ((in_RSI->look_ahead_).token_ == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,pTVar7);
    }
    if ((in_RSI->look_ahead_).token_ == 0x7d) break;
    if ((in_RSI->look_ahead_).token_ == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,pTVar7);
    }
    if ((in_RSI->look_ahead_).token_ == 0x5b) {
      NextToken(in_RSI);
      if ((in_RSI->current_).token_ != 0x5b) {
        __assert_fail("current_.token_ == \'[\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                      ,0x313,
                      "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseTableIndexField()"
                     );
      }
      if ((in_RSI->look_ahead_).token_ == 0x11e) {
        luna::Lexer::GetToken(in_RSI->lexer_,pTVar7);
      }
      iVar1 = (in_RSI->look_ahead_).line_;
      local_c8.number_ = 0.0;
      local_78.number_ = 0.0;
      aStack_70.number_ = 0.0;
      local_68.number_ = 0.0;
      aStack_60._0_4_ = 0x11e;
      op.line_ = 0;
      op.column_ = 0;
      op.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
      op.module_ = (String *)0x0;
      op._24_8_ = aStack_60.str_;
      ParseExp((ParserImpl *)local_c0,
               (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,op,
               (int)&local_c8);
      if (local_c8.str_ != (String *)0x0) {
        (*((local_c8.str_)->super_GCObject)._vptr_GCObject[1])();
      }
      local_c8.number_ = 0.0;
      pTVar4 = NextToken(in_RSI);
      if (pTVar4->token_ != 0x5d) {
        pPVar6 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException(pPVar6,"expect \']\'",local_a8);
LAB_0012e642:
        __cxa_throw(pPVar6,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      }
      pTVar4 = NextToken(in_RSI);
      if (pTVar4->token_ != 0x3d) {
        pPVar6 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException(pPVar6,"expect \'=\'",local_a8);
        goto LAB_0012e642;
      }
      local_b0.number_ = 0.0;
      local_98.number_ = 0.0;
      pSStack_90 = (String *)0x0;
      local_88._0_4_ = 0;
      local_88._4_4_ = 0;
      iStack_80 = 0x11e;
      op_00._28_4_ = uStack_7c;
      op_00.token_ = 0x11e;
      op_00.line_ = 0;
      op_00.column_ = 0;
      op_00.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
      op_00.module_ = (String *)0x0;
      ParseExp((ParserImpl *)(local_c0 + 8),
               (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,op_00,
               (int)&local_b0);
      if (local_b0.str_ != (String *)0x0) {
        (*((local_b0.str_)->super_GCObject)._vptr_GCObject[1])();
      }
      local_b0.number_ = 0.0;
      local_a0.str_ = (String *)operator_new(0x20);
      uVar3 = local_c0._8_8_;
      uVar2 = local_c0._0_8_;
      local_c0._0_8_ = (Lexer *)0x0;
      local_c0._8_8_ = (void *)0x0;
      ((local_a0.str_)->super_GCObject)._vptr_GCObject =
           (_func_int **)&PTR__TableIndexField_00154458;
      ((local_a0.str_)->super_GCObject).next_ = (GCObject *)uVar2;
      *(undefined8 *)&((local_a0.str_)->super_GCObject).field_0x10 = uVar3;
      *(int *)&(local_a0.str_)->field_1 = iVar1;
      std::
      vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
      ::emplace_back<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>
                (this_00,(unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                         &local_a0);
      aVar8 = local_a0;
    }
    else {
      if ((in_RSI->look_ahead_).token_ == 0x11e) {
        luna::Lexer::GetToken(in_RSI->lexer_,pTVar7);
      }
      if ((in_RSI->look_ahead_).token_ == 0x115) {
        pTVar4 = LookAhead2(in_RSI);
        if (pTVar4->token_ == 0x3d) {
          paVar5 = &NextToken(in_RSI)->field_0;
          local_78 = *paVar5;
          aStack_70 = paVar5[1];
          local_68 = paVar5[2];
          aStack_60 = paVar5[3];
          NextToken(in_RSI);
          if ((in_RSI->current_).token_ != 0x3d) {
            __assert_fail("current_.token_ == \'=\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                          ,0x32a,
                          "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseTableNameField()"
                         );
          }
          local_c8.number_ = 0.0;
          local_98.number_ = 0.0;
          pSStack_90 = (String *)0x0;
          local_88._0_4_ = 0;
          local_88._4_4_ = 0;
          iStack_80 = 0x11e;
          op_01._28_4_ = uStack_7c;
          op_01.token_ = 0x11e;
          op_01.line_ = 0;
          op_01.column_ = 0;
          op_01.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
          op_01.module_ = (String *)0x0;
          ParseExp((ParserImpl *)local_c0,
                   (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,
                   op_01,(int)&local_c8);
          if (local_c8.str_ != (String *)0x0) {
            (*((local_c8.str_)->super_GCObject)._vptr_GCObject[1])();
          }
          local_c8.number_ = 0.0;
          local_c0._8_8_ = operator_new(0x30);
          uVar2 = local_c0._0_8_;
          local_c0._0_8_ = (Lexer *)0x0;
          (((String *)local_c0._8_8_)->super_GCObject)._vptr_GCObject = local_40;
          (((String *)local_c0._8_8_)->super_GCObject).next_ = (GCObject *)local_78;
          *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)
           &(((String *)local_c0._8_8_)->super_GCObject).field_0x10 = aStack_70;
          (((String *)local_c0._8_8_)->field_1).str_ = (char *)local_68;
          *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)
           ((long)&((String *)local_c0._8_8_)->field_1 + 8) = aStack_60;
          *(undefined8 *)&((String *)local_c0._8_8_)->length_ = uVar2;
          std::
          vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
          ::emplace_back<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>
                    (this_00,(unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *
                             )(local_c0 + 8));
          aVar8 = (anon_union_8_2_010d16d7_for_TokenDetail_0)local_c0._8_8_;
          goto LAB_0012e540;
        }
      }
      if ((in_RSI->look_ahead_).token_ == 0x11e) {
        luna::Lexer::GetToken(in_RSI->lexer_,pTVar7);
      }
      iVar1 = (in_RSI->look_ahead_).line_;
      local_c0._0_8_ = (Lexer *)0x0;
      local_78.number_ = 0.0;
      aStack_70.number_ = 0.0;
      local_68.number_ = 0.0;
      aStack_60._0_4_ = 0x11e;
      op_02.line_ = 0;
      op_02.column_ = 0;
      op_02.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
      op_02.module_ = (String *)0x0;
      op_02._24_8_ = aStack_60.str_;
      ParseExp((ParserImpl *)&local_98,
               (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,op_02,
               (int)local_c0);
      if ((Lexer *)local_c0._0_8_ != (Lexer *)0x0) {
        (*(code *)((*(State **)local_c0._0_8_)->string_pool_)._M_t.
                  super___uniq_ptr_impl<luna::StringPool,_std::default_delete<luna::StringPool>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_luna::StringPool_*,_std::default_delete<luna::StringPool>_>
                  .super__Head_base<0UL,_luna::StringPool_*,_false>._M_head_impl)();
      }
      local_c0._0_8_ = (Lexer *)0x0;
      local_c8.str_ = (String *)operator_new(0x18);
      aVar8 = local_98;
      local_98.number_ = 0.0;
      ((local_c8.str_)->super_GCObject)._vptr_GCObject = local_38;
      ((local_c8.str_)->super_GCObject).next_ = (GCObject *)aVar8;
      *(int *)&((local_c8.str_)->super_GCObject).field_0x10 = iVar1;
      std::
      vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
      ::emplace_back<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>
                (this_00,(unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                         &local_c8);
      aVar8 = local_c8;
    }
LAB_0012e540:
    if (aVar8.str_ != (String *)0x0) {
      (*((aVar8.str_)->super_GCObject)._vptr_GCObject[1])();
    }
    if ((in_RSI->look_ahead_).token_ == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,pTVar7);
    }
    if ((in_RSI->look_ahead_).token_ != 0x7d) {
      NextToken(in_RSI);
      iVar1 = (in_RSI->current_).token_;
      if ((iVar1 != 0x2c) && (iVar1 != 0x3b)) {
        pPVar6 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException
                  (pPVar6,"expect \',\' or \';\' to split table fields",local_a8);
LAB_0012e5ae:
        __cxa_throw(pPVar6,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      }
    }
  }
  pTVar7 = NextToken(in_RSI);
  if (pTVar7->token_ == 0x7d) {
    (local_48._M_head_impl)->_vptr_SyntaxTree = local_50;
    return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
           (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
           local_48._M_head_impl;
  }
  pPVar6 = (ParseException *)__cxa_allocate_exception(0x20);
  luna::ParseException::ParseException(pPVar6,"expect \'}\' for table",local_a8);
  goto LAB_0012e5ae;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseTableConstructor()
        {
            NextToken();
            assert(current_.token_ == '{');

            std::unique_ptr<TableDefine> table(new TableDefine(current_.line_));

            while (LookAhead().token_ != '}')
            {
                if (LookAhead().token_ == '[')
                    table->fields_.push_back(ParseTableIndexField());
                else if (LookAhead().token_ == Token_Id && LookAhead2().token_ == '=')
                    table->fields_.push_back(ParseTableNameField());
                else
                    table->fields_.push_back(ParseTableArrayField());

                if (LookAhead().token_ != '}')
                {
                    NextToken();
                    if (current_.token_ != ',' && current_.token_ != ';')
                        throw ParseException("expect ',' or ';' to split table fields", current_);
                }
            }

            if (NextToken().token_ != '}')
                throw ParseException("expect '}' for table", current_);
            return std::move(table);
        }